

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int compression_end_zstd(archive *a,la_zstream_conflict *lastrm)

{
  ZSTD_freeCStream(lastrm->real_stream);
  lastrm->valid = 0;
  lastrm->real_stream = (void *)0x0;
  return 0;
}

Assistant:

static int
compression_end_zstd(struct archive *a, struct la_zstream *lastrm)
{
	ZSTD_CStream *strm;

	(void)a; /* UNUSED */
	strm = (ZSTD_CStream *)lastrm->real_stream;
	ZSTD_freeCStream(strm);
	lastrm->valid = 0;
	lastrm->real_stream = NULL;
	return (ARCHIVE_OK);
}